

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AStateProvider_A_CheckForReload
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  DObject *this;
  AInventory *this_00;
  AWeapon *this_01;
  MetaClass *cls;
  FState *val;
  VMValue *pVVar2;
  bool bVar3;
  bool local_82;
  bool local_7f;
  int local_7c;
  int ReloadCounter;
  AWeapon *weapon;
  bool dontincrement;
  FState *jump;
  int count;
  FState *state;
  FStateParamInfo *stateinfo;
  AStateProvider *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x116e,
                  "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x116e,
                  "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (DObject *)(param->field_0).field_1.a;
  local_7f = true;
  if (this != (DObject *)0x0) {
    local_7f = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
  }
  if (local_7f == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x116e,
                  "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x116e,
                  "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar3 = false;
  if ((param[1].field_0.field_3.Type == '\x03') &&
     (bVar3 = true, param[1].field_0.field_1.atag != 1)) {
    bVar3 = param[1].field_0.field_1.a == (void *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x116e,
                  "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this_00 = (AInventory *)param[1].field_0.field_1.a;
  local_82 = true;
  if (this_00 != (AInventory *)0x0) {
    local_82 = DObject::IsKindOf((DObject *)this_00,AStateProvider::RegistrationInfo.MyClass);
  }
  if (local_82 == false) {
    __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AStateProvider))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x116e,
                  "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 3) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x116e,
                  "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[2].field_0.field_3.Type != '\x03') {
    __assert_fail("param[paramnum].Type == REGT_POINTER",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x116e,
                  "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((this[0xe]._vptr_DObject == (_func_int **)0x0) ||
     (this[0xe]._vptr_DObject[0x1a] == (_func_int *)0x0)) {
    if (numret < 1) {
      param_local._4_4_ = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1172,
                      "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      VMReturn::SetPointer(ret,(void *)0x0,0);
      param_local._4_4_ = 1;
    }
  }
  else {
    if (numparam < 4) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1174,
                    "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (param[3].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1174,
                    "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_7c = param[3].field_0.i;
    if (numparam < 5) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1175,
                    "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (param[4].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1175,
                    "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar1 = param[4].field_0.i;
    cls = AInventory::GetClass(this_00);
    val = FStateLabelStorage::GetState(&StateLabels,iVar1,&cls->super_PClassActor,false);
    if (numparam < 6) {
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
      if ((pVVar2->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1176,
                      "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
      iVar1 = (pVVar2->field_0).i;
    }
    else {
      if (param[5].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1176,
                      "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      iVar1 = param[5].field_0.i;
    }
    self._4_4_ = numret;
    if (0 < numret) {
      VMReturn::SetPointer(ret,(void *)0x0,0);
      self._4_4_ = 1;
    }
    this_01 = (AWeapon *)this[0xe]._vptr_DObject[0x1a];
    if ((iVar1 == 0) || (this_01->ReloadCounter != 0)) {
      local_7c = (this_01->ReloadCounter + 1) % local_7c;
    }
    else {
      local_7c = 1;
    }
    if (local_7c == 0) {
      AWeapon::CheckAmmo(this_01,0,false,false,-1);
    }
    else if (self._4_4_ != 0) {
      VMReturn::SetPointer(ret,val,0);
    }
    if (iVar1 == 0) {
      this_01->ReloadCounter = local_7c;
    }
    param_local._4_4_ = self._4_4_;
  }
  return param_local._4_4_;
}

Assistant:

DEFINE_ACTION_FUNCTION(AStateProvider, A_CheckForReload)
{
	PARAM_ACTION_PROLOGUE(AStateProvider);

	if ( self->player == NULL || self->player->ReadyWeapon == NULL )
	{
		ACTION_RETURN_STATE(NULL);
	}
	PARAM_INT		(count);
	PARAM_STATE_ACTION	(jump);
	PARAM_BOOL_DEF	(dontincrement);

	if (numret > 0)
	{
		ret->SetPointer(NULL, ATAG_STATE);
		numret = 1;
	}

	AWeapon *weapon = self->player->ReadyWeapon;

	int ReloadCounter = weapon->ReloadCounter;
	if (!dontincrement || ReloadCounter != 0)
		ReloadCounter = (weapon->ReloadCounter+1) % count;
	else // 0 % 1 = 1?  So how do we check if the weapon was never fired?  We should only do this when we're not incrementing the counter though.
		ReloadCounter = 1;

	// If we have not made our last shot...
	if (ReloadCounter != 0)
	{
		// Go back to the refire frames, instead of continuing on to the reload frames.
		if (numret != 0)
		{
			ret->SetPointer(jump, ATAG_STATE);
		}
	}
	else
	{
		// We need to reload. However, don't reload if we're out of ammo.
		weapon->CheckAmmo(false, false);
	}
	if (!dontincrement)
	{
		weapon->ReloadCounter = ReloadCounter;
	}
	return numret;
}